

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState_DataSource::TracingServiceState_DataSource
          (TracingServiceState_DataSource *this)

{
  TracingServiceState_DataSource *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_DataSource_009c1068;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::CopyablePtr
            (&this->ds_descriptor_);
  this->producer_id_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<3UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TracingServiceState_DataSource::TracingServiceState_DataSource() = default;